

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  undefined1 *puVar3;
  XMLCh *pXVar4;
  XMLCh XVar5;
  long lVar6;
  XMLCh *pXVar7;
  bool bVar8;
  
  pXVar4 = this->fMsgDomain;
  if (pXVar4 == L"http://apache.org/xml/messages/XMLErrors") {
LAB_0033f618:
    if (0x120 < msgToLoad) {
      return false;
    }
    lVar6 = (ulong)(msgToLoad - 1) << 8;
    puVar3 = gXMLErrArray;
    goto LAB_0033f6ff;
  }
  pXVar2 = L"http://apache.org/xml/messages/XMLErrors";
  pXVar7 = pXVar4;
  if (pXVar4 == (XMLCh *)0x0) {
LAB_0033f5d9:
    if (*pXVar2 == L'\0') goto LAB_0033f618;
  }
  else {
    do {
      XVar5 = *pXVar7;
      if (XVar5 == L'\0') goto LAB_0033f5d9;
      XVar1 = *pXVar2;
      pXVar2 = pXVar2 + 1;
      pXVar7 = pXVar7 + 1;
    } while (XVar5 == XVar1);
  }
  if (pXVar4 == L"http://apache.org/xml/messages/XML4CErrors") {
LAB_0033f671:
    if (0x171 < msgToLoad) {
      return false;
    }
    lVar6 = (ulong)(msgToLoad - 1) << 8;
    puVar3 = gXMLExceptArray;
    goto LAB_0033f6ff;
  }
  pXVar2 = L"http://apache.org/xml/messages/XML4CErrors";
  pXVar7 = pXVar4;
  if (pXVar4 == (XMLCh *)0x0) {
LAB_0033f636:
    if (*pXVar2 == L'\0') goto LAB_0033f671;
  }
  else {
    do {
      XVar5 = *pXVar7;
      if (XVar5 == L'\0') goto LAB_0033f636;
      XVar1 = *pXVar2;
      pXVar2 = pXVar2 + 1;
      pXVar7 = pXVar7 + 1;
    } while (XVar5 == XVar1);
  }
  if (pXVar4 == L"http://apache.org/xml/messages/XMLValidity") {
LAB_0033f6c2:
    if (msgToLoad < 0x55) {
      lVar6 = (ulong)(msgToLoad - 1) << 8;
      puVar3 = gXMLValidityArray;
LAB_0033f6ff:
      pXVar4 = (XMLCh *)(puVar3 + lVar6);
      XVar5 = *pXVar4;
      if (0 < (long)maxChars && XVar5 != L'\0') {
        pXVar2 = toFill + maxChars;
        do {
          pXVar4 = pXVar4 + 1;
          *toFill = XVar5;
          toFill = toFill + 1;
          XVar5 = *pXVar4;
          if (XVar5 == L'\0') break;
        } while (toFill < pXVar2);
      }
      *toFill = L'\0';
      return true;
    }
  }
  else {
    pXVar2 = L"http://apache.org/xml/messages/XMLValidity";
    pXVar7 = pXVar4;
    if (pXVar4 == (XMLCh *)0x0) {
LAB_0033f688:
      if (*pXVar2 == L'\0') goto LAB_0033f6c2;
    }
    else {
      do {
        XVar5 = *pXVar7;
        if (XVar5 == L'\0') goto LAB_0033f688;
        XVar1 = *pXVar2;
        pXVar2 = pXVar2 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar5 == XVar1);
    }
    if (pXVar4 == L"http://apache.org/xml/messages/XMLDOMMsg") {
      bVar8 = false;
    }
    else {
      pXVar2 = L"http://apache.org/xml/messages/XMLDOMMsg";
      if (pXVar4 != (XMLCh *)0x0) {
        while (XVar5 = *pXVar4, XVar5 != L'\0') {
          pXVar4 = pXVar4 + 1;
          XVar1 = *pXVar2;
          pXVar2 = pXVar2 + 1;
          if (XVar5 != XVar1) {
            return false;
          }
        }
      }
      bVar8 = *pXVar2 != L'\0';
    }
    if ((msgToLoad < 0x2a) && (!bVar8)) {
      lVar6 = (ulong)(msgToLoad - 1) << 8;
      puVar3 = gXMLDOMMsgArray;
      goto LAB_0033f6ff;
    }
  }
  return false;
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars)
{
    //
    //  Just use the id to map into the correct array of messages. Then
    //  copy that to the caller's buffer.
    //
    //  NOTE:   The source text is in little endian form. So, if we are a
    //          big endian machine, flip them in the process.
    //
    XMLCh* endPtr = toFill + maxChars;
    XMLCh* outPtr = toFill;
    const XMLCh* srcPtr = 0;

    if (XMLString::equals(fMsgDomain, XMLUni::fgXMLErrDomain))
    {
        if ( msgToLoad > gXMLErrArraySize)
            return false;
        else
            srcPtr = gXMLErrArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgExceptDomain))
    {
         if ( msgToLoad > gXMLExceptArraySize)
            return false;
         else
             srcPtr = gXMLExceptArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgValidityDomain))
    {
         if ( msgToLoad > gXMLValidityArraySize)
            return false;
         else
             srcPtr = gXMLValidityArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgXMLDOMMsgDomain))
    {
         if ( msgToLoad > gXMLDOMMsgArraySize)
            return false;
         else
             srcPtr = gXMLDOMMsgArray[msgToLoad - 1];
    } else {
	return false;
    }

     while (*srcPtr && (outPtr < endPtr))
     {
         *outPtr++ = *srcPtr++;
     }
     *outPtr = 0;

     return true;
}